

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O0

void __thiscall
MergeTest_MergeCompareTime_Test_Test::TestBody(MergeTest_MergeCompareTime_Test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  result_type rVar4;
  reference pvVar5;
  clock_t cVar6;
  clock_t cVar7;
  ostream *poVar8;
  void *this_00;
  char *message;
  char *in_R9;
  string local_1488;
  AssertHelper local_1468;
  Message local_1460;
  bool local_1451;
  undefined1 local_1450 [8];
  AssertionResult gtest_ar_;
  int i_2;
  int numHeap_1;
  clock_t t;
  uint local_1428;
  int elem;
  int numHeap;
  int i_1;
  HeapList tested;
  FoolHeapList fool;
  uint local_13d8;
  int type;
  int i;
  allocator<int> local_13c1;
  undefined1 local_13c0 [8];
  vector<int,_std::allocator<int>_> values;
  size_t number;
  size_t size;
  mt19937 generator;
  MergeTest_MergeCompareTime_Test_Test *this_local;
  
  generator._M_p = (size_t)this;
  rVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&size,rVar4);
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3e8;
  std::allocator<int>::allocator(&local_13c1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_13c0,1000000,&local_13c1);
  std::allocator<int>::~allocator(&local_13c1);
  for (local_13d8 = 0; local_13d8 < 1000000; local_13d8 = local_13d8 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&size);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_13c0,(long)(int)local_13d8);
    *pvVar5 = (value_type)rVar4;
  }
  for (fool.super_HeapList._28_4_ = 0; (int)fool.super_HeapList._28_4_ < 3;
      fool.super_HeapList._28_4_ = fool.super_HeapList._28_4_ + 1) {
    FoolHeapList::FoolHeapList((FoolHeapList *)&tested.TYPE);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_13c0,0);
    HeapList::AddHeap((HeapList *)&tested.TYPE,*pvVar5);
    HeapList::HeapList((HeapList *)&numHeap,fool.super_HeapList._28_4_);
    for (elem = 0; (uint)elem < 999999; elem = elem + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_13c0,(long)(elem + 1));
      HeapList::Insert((HeapList *)&tested.TYPE,0,*pvVar5);
    }
    for (local_1428 = 0; local_1428 < 1000; local_1428 = local_1428 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_13c0,
                          (long)(int)(local_1428 * 1000));
      HeapList::AddHeap((HeapList *)&numHeap,*pvVar5);
      for (t._4_4_ = 1; t._4_4_ < 1000; t._4_4_ = t._4_4_ + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_13c0,
                            (long)(int)(local_1428 * 1000 + t._4_4_));
        HeapList::Insert((HeapList *)&numHeap,local_1428,*pvVar5);
      }
    }
    cVar6 = clock();
    for (gtest_ar_.message_.ptr_._4_4_ = 1; gtest_ar_.message_.ptr_._4_4_ < 1000;
        gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ + 1) {
      HeapList::Meld((HeapList *)&numHeap,0,gtest_ar_.message_.ptr_._4_4_);
    }
    cVar7 = clock();
    poVar8 = std::operator<<((ostream *)&std::cout,"time of merging for heap of type ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,fool.super_HeapList._28_4_);
    poVar8 = std::operator<<(poVar8,' ');
    this_00 = (void *)std::ostream::operator<<(poVar8,(double)(cVar7 - cVar6) / 1000000.0);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    for (gtest_ar_.message_.ptr_._0_4_ = 0; (uint)gtest_ar_.message_.ptr_ < 1000000;
        gtest_ar_.message_.ptr_._0_4_ = (uint)gtest_ar_.message_.ptr_ + 1) {
      iVar2 = HeapList::ExtractMin((HeapList *)&tested.TYPE,0);
      iVar3 = HeapList::ExtractMin((HeapList *)&numHeap,0);
      local_1451 = iVar2 == iVar3;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1450,&local_1451,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1450);
      if (!bVar1) {
        testing::Message::Message(&local_1460);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1488,(internal *)local_1450,
                   (AssertionResult *)"fool.ExtractMin(0) == tested.ExtractMin(0)","false","true",
                   in_R9);
        message = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0xa2,message);
        testing::internal::AssertHelper::operator=(&local_1468,&local_1460);
        testing::internal::AssertHelper::~AssertHelper(&local_1468);
        std::__cxx11::string::~string((string *)&local_1488);
        testing::Message::~Message(&local_1460);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1450);
    }
    HeapList::~HeapList((HeapList *)&numHeap);
    FoolHeapList::~FoolHeapList((FoolHeapList *)&tested.TYPE);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_13c0);
  return;
}

Assistant:

TEST(MergeTest, MergeCompareTime_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        clock_t t = clock();

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        t = clock() - t;

        std::cout << "time of merging for heap of type " << type << ' ' << double(t) / CLOCKS_PER_SEC << std::endl;

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}